

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha512_Final(SHA512_CTX *context,sha2_byte *digest)

{
  ulong uVar1;
  uint64_t tmp;
  int j;
  sha2_byte *digest_local;
  SHA512_CTX *context_local;
  
  if (digest != (sha2_byte *)0x0) {
    sha512_Last(context);
    for (tmp._4_4_ = 0; tmp._4_4_ < 8; tmp._4_4_ = tmp._4_4_ + 1) {
      uVar1 = context->state[tmp._4_4_] >> 0x20 | context->state[tmp._4_4_] << 0x20;
      uVar1 = (uVar1 & 0xff00ff00ff00ff00) >> 8 | (uVar1 & 0xff00ff00ff00ff) << 8;
      context->state[tmp._4_4_] =
           (uVar1 & 0xffff0000ffff0000) >> 0x10 | (uVar1 & 0xffff0000ffff) << 0x10;
    }
    memcpy(digest,context,0x40);
  }
  memzero(context,0xd0);
  return;
}

Assistant:

void sha512_Final(trezor::SHA512_CTX* context, sha2_byte digest[]) {
	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		sha512_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE64(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA512_DIGEST_LENGTH);
	}

	/* Zero out state data */
	memzero(context, sizeof(trezor::SHA512_CTX));
}